

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.h
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::JavascriptLibrary
          (JavascriptLibrary *this,GlobalObject *globalObject,Recycler *recycler)

{
  JavascriptLibraryBase::JavascriptLibraryBase(&this->super_JavascriptLibraryBase,globalObject);
  (this->super_JavascriptLibraryBase).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013990a8;
  (this->cacheForCopyOnAccessArraySegments).ptr = (CacheForCopyOnAccessArraySegments *)0x0;
  memset(&this->externalLibraryList,0,0x398);
  memset(this->typeDisplayStrings,0,0x510);
  PropertyDescriptor::PropertyDescriptor(&this->defaultPropertyDescriptor);
  memset(&this->stringCache,0,0x558);
  CharStringCache::CharStringCache(&this->charStringCache);
  memset(&this->nativeHostPromiseContinuationFunctionState,0,0x340);
  memset(&(this->cache).lastUtcTimeFromStrString,0,0x98);
  (this->jsrtContextObject).ptr = (FinalizableObject *)0x0;
  (this->jsrtExternalTypesCache).ptr =
       (WeakReferenceDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
        *)0x0;
  (this->fakeGlobalFuncForUndefer).ptr = (FunctionBody *)0x0;
  (this->customExternalWrapperTypesCache).ptr =
       (WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
        *)0x0;
  (this->moduleRecordList).ptr =
       (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::PrototypeChainCache
            (&this->typesWithOnlyWritablePropertyProtoChain,recycler);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::PrototypeChainCache
            (&this->typesWithNoSpecialPropertyProtoChain,recycler);
  this->inProfileMode = false;
  this->inDispatchProfileMode = false;
  (this->debugDisposableObjectType).ptr = (DynamicType *)0x0;
  (this->debugFuncExecutorInDisposeObjectType).ptr = (DynamicType *)0x0;
  (this->referencedPropertyRecords).ptr =
       (BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  Memory::WriteBarrierPtr<Js::GlobalObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).globalObject,globalObject);
  return;
}

Assistant:

JavascriptLibrary(GlobalObject* globalObject, Recycler * recycler) :
            JavascriptLibraryBase(globalObject),
            inProfileMode(false),
            inDispatchProfileMode(false),
            propertyStringMap(nullptr),
            symbolMap(nullptr),
            parseIntFunctionObject(nullptr),
            evalFunctionObject(nullptr),
            parseFloatFunctionObject(nullptr),
            arrayPrototypeToLocaleStringFunction(nullptr),
            arrayPrototypeToStringFunction(nullptr),
            identityFunction(nullptr),
            throwerFunction(nullptr),
            jsrtContextObject(nullptr),
            jsrtExternalTypesCache(nullptr),
            customExternalWrapperTypesCache(nullptr),
            fakeGlobalFuncForUndefer(nullptr),
            externalLibraryList(nullptr),
#if ENABLE_COPYONACCESS_ARRAY
            cacheForCopyOnAccessArraySegments(nullptr),
#endif
            referencedPropertyRecords(nullptr),
            moduleRecordList(nullptr),
            rootPath(nullptr),
            bindRefChunkBegin(nullptr),
            bindRefChunkCurrent(nullptr),
            bindRefChunkEnd(nullptr),
            dynamicFunctionReference(nullptr),
            typesWithOnlyWritablePropertyProtoChain(recycler),
            typesWithNoSpecialPropertyProtoChain(recycler)
        {
            this->globalObject = globalObject;
        }